

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O1

char * mp_encode_str_safe(char *data,ptrdiff_t *data_sz,char *str,uint32_t len)

{
  int iVar1;
  long lVar2;
  
  if (data_sz != (ptrdiff_t *)0x0) {
    iVar1 = 1;
    if ((0x1f < len) && (iVar1 = 2, 0xff < len)) {
      iVar1 = (uint)(0xffff < len) * 2 + 3;
    }
    *data_sz = *data_sz - (ulong)(iVar1 + len);
    if (*data_sz < 0) {
      return data;
    }
  }
  if (len < 0x20) {
    *data = (byte)len | 0xa0;
    lVar2 = 1;
  }
  else if (len < 0x100) {
    *data = -0x27;
    data[1] = (byte)len;
    lVar2 = 2;
  }
  else if (len < 0x10000) {
    *data = -0x26;
    *(ushort *)(data + 1) = (ushort)len << 8 | (ushort)len >> 8;
    lVar2 = 3;
  }
  else {
    *data = -0x25;
    *(uint32_t *)(data + 1) =
         len >> 0x18 | (len & 0xff0000) >> 8 | (len & 0xff00) << 8 | len << 0x18;
    lVar2 = 5;
  }
  memcpy(data + lVar2,str,(ulong)len);
  return data + lVar2 + len;
}

Assistant:

MP_IMPL char *
mp_encode_str_safe(char *data, ptrdiff_t *data_sz,
		   const char *str, uint32_t len)
{
	if (data_sz != NULL) {
		*data_sz -= mp_sizeof_str(len);
		if (*data_sz < 0)
			return data;
	}
	return mp_encode_str(data, str, len);
}